

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

void __thiscall
QDialogButtonBoxPrivate::createStandardButtons
          (QDialogButtonBoxPrivate *this,StandardButtons buttons)

{
  StandardButton sbutton;
  bool bVar1;
  
  sbutton = FirstButton;
  do {
    if ((sbutton &
        (uint)buttons.super_QFlagsStorageHelper<QDialogButtonBox::StandardButton,_4>.
              super_QFlagsStorage<QDialogButtonBox::StandardButton>.i) != NoButton) {
      createButton(this,sbutton,SkipLayout);
    }
    bVar1 = sbutton < 0x4000001;
    sbutton = sbutton * 2;
  } while (bVar1);
  layoutButtons(this);
  return;
}

Assistant:

void QDialogButtonBoxPrivate::createStandardButtons(QDialogButtonBox::StandardButtons buttons)
{
    uint i = QDialogButtonBox::FirstButton;
    while (i <= QDialogButtonBox::LastButton) {
        if (i & buttons)
            createButton(QDialogButtonBox::StandardButton(i), LayoutRule::SkipLayout);
        i = i << 1;
    }
    layoutButtons();
}